

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_32f1a0::Db::parse(Db *this)

{
  bool bVar1;
  char cVar2;
  Db *pDVar3;
  size_t sVar4;
  byte local_92;
  byte local_91;
  Node *Ty;
  byte local_69;
  undefined1 auStack_68 [7];
  bool RequireNumber;
  Node *local_58;
  Node *Encoding_1;
  StringView local_40;
  Db *local_30;
  Node *Encoding;
  Db *local_18;
  Db *this_local;
  
  local_18 = this;
  StringView::StringView((StringView *)&Encoding,"_Z");
  bVar1 = consumeIf(this,_Encoding);
  if (bVar1) {
    local_30 = (Db *)parseEncoding(this);
    if (local_30 == (Db *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      cVar2 = look(this,0);
      if (cVar2 == '.') {
        StringView::StringView(&local_40,this->First,this->Last);
        local_30 = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::DotSuffix,(anonymous_namespace)::Node*&,StringView>
                                   ((Db *)this,(Node **)&local_30,&local_40);
        this->First = this->Last;
      }
      sVar4 = numLeft(this);
      if (sVar4 == 0) {
        this_local = local_30;
      }
      else {
        this_local = (Db *)0x0;
      }
    }
  }
  else {
    StringView::StringView((StringView *)&Encoding_1,"___Z");
    bVar1 = consumeIf(this,_Encoding_1);
    if (bVar1) {
      local_58 = parseEncoding(this);
      local_91 = 1;
      if (local_58 != (Node *)0x0) {
        StringView::StringView((StringView *)auStack_68,"_block_invoke");
        bVar1 = consumeIf(this,_auStack_68);
        local_91 = bVar1 ^ 0xff;
      }
      if ((local_91 & 1) == 0) {
        local_69 = consumeIf(this,'_');
        _Ty = parseNumber(this,false);
        bVar1 = StringView::empty((StringView *)&Ty);
        local_92 = 0;
        if (bVar1) {
          local_92 = local_69;
        }
        if ((local_92 & 1) == 0) {
          sVar4 = numLeft(this);
          if (sVar4 == 0) {
            this_local = (Db *)(anonymous_namespace)::Db::
                               make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
                                         ((Db *)this,
                                          (char (*) [34])"invocation function for block in ",
                                          &local_58);
          }
          else {
            this_local = (Db *)0x0;
          }
        }
        else {
          this_local = (Db *)0x0;
        }
      }
      else {
        this_local = (Db *)0x0;
      }
    }
    else {
      pDVar3 = (Db *)parseType(this);
      sVar4 = numLeft(this);
      this_local = pDVar3;
      if (sVar4 != 0) {
        this_local = (Db *)0x0;
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parse() {
  if (consumeIf("_Z")) {
    Node *Encoding = parseEncoding();
    if (Encoding == nullptr)
      return nullptr;
    if (look() == '.') {
      Encoding = make<DotSuffix>(Encoding, StringView(First, Last));
      First = Last;
    }
    if (numLeft() != 0)
      return nullptr;
    return Encoding;
  }

  if (consumeIf("___Z")) {
    Node *Encoding = parseEncoding();
    if (Encoding == nullptr || !consumeIf("_block_invoke"))
      return nullptr;
    bool RequireNumber = consumeIf('_');
    if (parseNumber().empty() && RequireNumber)
      return nullptr;
    if (numLeft() != 0)
      return nullptr;
    return make<SpecialName>("invocation function for block in ", Encoding);
  }

  Node *Ty = parseType();
  if (numLeft() != 0)
    return nullptr;
  return Ty;
}